

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolJPolValPair.cpp
# Opt level: O2

void __thiscall
PolicyPoolJPolValPair::Insert(PolicyPoolJPolValPair *this,PolicyPoolItemInterface_sharedPtr *ppi)

{
  E *this_00;
  JointPolicyValuePair_sharedPtr jp;
  
  boost::dynamic_pointer_cast<JointPolicyValuePair,PolicyPoolItemInterface>((boost *)&jp,ppi);
  if (jp.px != (element_type *)0x0) {
    std::
    priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
    ::push(this->_m_jpvpQueue_p,&jp);
    boost::detail::shared_count::~shared_count(&jp.pn);
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"PolicyPoolJPolValPair::Insert could not cast input to JointPolicyValuePair");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void PolicyPoolJPolValPair::Insert(PolicyPoolItemInterface_sharedPtr  ppi)
{
    JointPolicyValuePair_sharedPtr jp = boost::dynamic_pointer_cast<JointPolicyValuePair>(ppi);

    if(jp==0)
        throw(E("PolicyPoolJPolValPair::Insert could not cast input to JointPolicyValuePair"));

    _m_jpvpQueue_p->push(jp);
    
}